

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O2

void printAddrMode3OffsetOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_struct *h;
  cs_detail *pcVar2;
  char *pcVar3;
  uint uVar4;
  MCOperand *op;
  MCOperand *op_00;
  ulong uVar5;
  ulong uVar6;
  cs_insn **ppcVar7;
  int iVar8;
  char *pcVar9;
  
  op = MCInst_getOperand(MI,OpNum);
  op_00 = MCInst_getOperand(MI,OpNum + 1);
  uVar5 = MCOperand_getImm(op_00);
  uVar4 = MCOperand_getReg(op);
  if (uVar4 == 0) {
    uVar6 = MCOperand_getImm(op_00);
    pcVar9 = "-";
    if ((uVar5 & 0x100) == 0) {
      pcVar9 = anon_var_dwarf_e7a99 + 0x11;
    }
    pcVar3 = ", #%s%u";
    if (9 < (byte)uVar6) {
      pcVar3 = ", #%s0x%x";
    }
    iVar8 = (int)(uVar6 & 0xff);
    SStream_concat(O,pcVar3 + 2,pcVar9,uVar6 & 0xff);
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    ppcVar7 = &MI->flat_insn;
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).arm.op_count * 0x28 + 0x42;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    if ((uVar5 & 0x100) == 0) {
      *(int *)((*ppcVar7)->detail->groups +
              (ulong)((*ppcVar7)->detail->field_6).arm.op_count * 0x28 + 0x46) = iVar8;
      (*ppcVar7)->detail->groups[(ulong)((*ppcVar7)->detail->field_6).arm.op_count * 0x28 + 0x56] =
           '\x01';
    }
    else {
      *(int *)((*ppcVar7)->detail->groups +
              (ulong)((*ppcVar7)->detail->field_6).arm.op_count * 0x28 + 0x46) = -iVar8;
    }
  }
  else {
    pcVar9 = "-";
    if ((uVar5 & 0x100) == 0) {
      pcVar9 = anon_var_dwarf_e7a99 + 0x11;
    }
    SStream_concat0(O,pcVar9);
    h = MI->csh;
    uVar4 = MCOperand_getReg(op);
    printRegName(h,O,uVar4);
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).arm.op_count * 0x28 + 0x42;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    uVar4 = MCOperand_getReg(op);
    pcVar2 = MI->flat_insn->detail;
    *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).arm.op_count * 0x28 + 0x46) = uVar4;
    pcVar2 = MI->flat_insn->detail;
    pcVar2->groups[(ulong)(pcVar2->field_6).arm.op_count * 0x28 + 0x56] = (byte)(uVar5 >> 8) & 1;
  }
  puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
  *puVar1 = *puVar1 + '\x01';
  return;
}

Assistant:

static void printAddrMode3OffsetOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	MCOperand *MO2 = MCInst_getOperand(MI, OpNum+1);
	ARM_AM_AddrOpc subtracted = getAM3Op((unsigned int)MCOperand_getImm(MO2));
	unsigned ImmOffs;

	if (MCOperand_getReg(MO1)) {
		SStream_concat0(O, ARM_AM_getAddrOpcStr(subtracted));
		printRegName(MI->csh, O, MCOperand_getReg(MO1));
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].subtracted = subtracted == ARM_AM_sub;
			MI->flat_insn->detail->arm.op_count++;
		}
		return;
	}

	ImmOffs = getAM3Offset((unsigned int)MCOperand_getImm(MO2));
	if (ImmOffs > HEX_THRESHOLD)
		SStream_concat(O, "#%s0x%x", ARM_AM_getAddrOpcStr(subtracted), ImmOffs);
	else
		SStream_concat(O, "#%s%u", ARM_AM_getAddrOpcStr(subtracted), ImmOffs);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;

		if (subtracted) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = ImmOffs;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].subtracted = true;
		} else
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = -(int)ImmOffs;

		MI->flat_insn->detail->arm.op_count++;
	}
}